

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O0

void __thiscall QTreeView::mouseReleaseEvent(QTreeView *this,QMouseEvent *event)

{
  long lVar1;
  int iVar2;
  State SVar3;
  QTreeViewPrivate *this_00;
  QStyle *pQVar4;
  QPoint *in_RSI;
  QTreeViewPrivate *in_RDI;
  long in_FS_OFFSET;
  QPointF QVar5;
  QMouseEvent *unaff_retaddr;
  QAbstractItemView *in_stack_00000008;
  QTreeViewPrivate *d;
  QWidget *in_stack_ffffffffffffff98;
  QTreeViewPrivate *this_01;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = in_RDI;
  this_00 = d_func((QTreeView *)0x8f908f);
  QVar5 = QSinglePointEvent::position((QSinglePointEvent *)0x8f90a8);
  QPointF::toPoint((QPointF *)this_00);
  iVar2 = QTreeViewPrivate::itemDecorationAt((QTreeViewPrivate *)QVar5.yp,(QPoint *)QVar5.xp);
  if (iVar2 == -1) {
    QAbstractItemView::mouseReleaseEvent(in_stack_00000008,unaff_retaddr);
  }
  else {
    SVar3 = QAbstractItemView::state((QAbstractItemView *)in_RDI);
    if ((SVar3 == DragSelectingState) ||
       (SVar3 = QAbstractItemView::state((QAbstractItemView *)in_RDI), SVar3 == DraggingState)) {
      QAbstractItemView::setState
                ((QAbstractItemView *)in_RDI,(State)((ulong)in_stack_ffffffffffffff98 >> 0x20));
    }
    pQVar4 = QWidget::style(in_stack_ffffffffffffff98);
    iVar2 = (**(code **)(*(long *)pQVar4 + 0xf0))(pQVar4,0x28,0,in_RDI);
    if (iVar2 == 3) {
      QSinglePointEvent::position((QSinglePointEvent *)0x8f9155);
      QPointF::toPoint((QPointF *)this_00);
      QTreeViewPrivate::expandOrCollapseItemAtPos(this_01,in_RSI);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTreeView::mouseReleaseEvent(QMouseEvent *event)
{
    Q_D(QTreeView);
    if (d->itemDecorationAt(event->position().toPoint()) == -1) {
        QAbstractItemView::mouseReleaseEvent(event);
    } else {
        if (state() == QAbstractItemView::DragSelectingState || state() == QAbstractItemView::DraggingState)
            setState(QAbstractItemView::NoState);
        if (style()->styleHint(QStyle::SH_ListViewExpand_SelectMouseType, nullptr, this) == QEvent::MouseButtonRelease)
            d->expandOrCollapseItemAtPos(event->position().toPoint());
    }
}